

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

void __thiscall
pbrt::SobolSampler::SobolSampler
          (SobolSampler *this,int spp,Point2i *fullResolution,RandomizeStrategy randomizeStrategy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  string ret;
  string local_38;
  
  uVar3 = (int)(spp - 1U) >> 1 | spp - 1U;
  uVar3 = (int)uVar3 >> 2 | uVar3;
  uVar3 = (int)uVar3 >> 4 | uVar3;
  uVar3 = (int)uVar3 >> 8 | uVar3;
  this->samplesPerPixel = ((int)uVar3 >> 0x10 | uVar3) + 1;
  this->randomizeStrategy = randomizeStrategy;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  this->dimension = 0;
  if (POPCOUNT(spp) != 1) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    detail::stringPrintfRecursive<int&>
              (&local_38,"Non power-of-two sample count rounded up to %d for SobolSampler.",
               &this->samplesPerPixel);
    Warning((FileLoc *)0x0,local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  iVar1 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).x;
  iVar2 = (fullResolution->super_Tuple2<pbrt::Point2,_int>).y;
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  uVar3 = (int)(iVar2 - 1U) >> 1 | iVar2 - 1U;
  uVar3 = (int)uVar3 >> 2 | uVar3;
  uVar3 = (int)uVar3 >> 4 | uVar3;
  uVar3 = (int)uVar3 >> 8 | uVar3;
  this->resolution = ((int)uVar3 >> 0x10 | uVar3) + 1;
  return;
}

Assistant:

SobolSampler(int spp, const Point2i &fullResolution,
                 RandomizeStrategy randomizeStrategy)
        : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizeStrategy) {
        if (!IsPowerOf2(spp))
            Warning("Non power-of-two sample count rounded up to %d "
                    "for SobolSampler.",
                    samplesPerPixel);
        resolution = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
    }